

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-view.c
# Opt level: O0

void calc_lighting(chunk_conflict *c,player *p)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  loc_conflict lVar5;
  loc_conflict lVar6;
  monster *mon_00;
  wchar_t local_5c;
  wchar_t local_54;
  monster_conflict *mon;
  wchar_t wStack_40;
  loc adj_grid;
  loc grid;
  wchar_t old_light;
  wchar_t radius;
  wchar_t light;
  wchar_t y;
  wchar_t x;
  wchar_t k;
  wchar_t dir;
  player *p_local;
  chunk_conflict *c_local;
  
  wVar3 = (p->state).cur_light;
  local_54 = wVar3;
  if (wVar3 < L'\0') {
    local_54 = -wVar3;
  }
  lVar5.x = (p->grid).x;
  lVar5.y = (p->grid).y;
  wVar2 = square_light((chunk *)c,lVar5);
  for (radius = L'\0'; radius < c->height; radius = radius + L'\x01') {
    for (light = L'\0'; light < c->width; light = light + L'\x01') {
      lVar5 = (loc_conflict)loc(light,radius);
      _Var1 = square_isglow((chunk *)c,lVar5);
      if ((_Var1) &&
         ((_Var1 = square_allowslos((chunk *)c,lVar5), _Var1 ||
          (_Var1 = glow_can_light_wall(c,p,(loc)lVar5), _Var1)))) {
        c->squares[radius][light].light = 1;
      }
      else {
        c->squares[radius][light].light = 0;
      }
      _Var1 = square_isbright((chunk *)c,lVar5);
      if (_Var1) {
        c->squares[radius][light].light = c->squares[radius][light].light + 2;
        for (x = L'\0'; x < L'\b'; x = x + L'\x01') {
          lVar6 = (loc_conflict)loc_sum((loc)lVar5,ddgrid_ddd[x]);
          _Var1 = square_in_bounds((chunk *)c,lVar6);
          if ((_Var1) &&
             ((_Var1 = square_allowslos((chunk *)c,lVar6), _Var1 ||
              (_Var1 = source_can_light_wall(c,p,(loc)lVar5,(loc)lVar6), _Var1)))) {
            wStack_40 = lVar6.y;
            mon._4_4_ = lVar6.x;
            c->squares[wStack_40][mon._4_4_].light = c->squares[wStack_40][mon._4_4_].light + 1;
          }
        }
      }
    }
  }
  add_light(c,p,p->grid,local_54 + L'\xffffffff',wVar3);
  for (y = L'\x01'; wVar3 = cave_monster_max(c), y < wVar3; y = y + L'\x01') {
    mon_00 = (monster *)cave_monster(c,y);
    if ((mon_00->race != (monster_race *)0x0) && (_Var1 = monster_is_camouflaged(mon_00), !_Var1)) {
      wVar3 = mon_00->race->light;
      local_5c = wVar3;
      if (wVar3 < L'\0') {
        local_5c = -wVar3;
      }
      if ((wVar3 != L'\0') &&
         (wVar4 = distance(p->grid,(loc)mon_00->grid),
         wVar4 - (local_5c + L'\xffffffff') <= (int)(uint)z_info->max_sight)) {
        add_light(c,p,(loc)mon_00->grid,local_5c + L'\xffffffff',wVar3);
      }
    }
  }
  lVar6.x = (p->grid).x;
  lVar6.y = (p->grid).y;
  wVar3 = square_light((chunk *)c,lVar6);
  if (wVar3 != wVar2) {
    p->upkeep->redraw = p->upkeep->redraw | 0x2000000;
  }
  return;
}

Assistant:

static void calc_lighting(struct chunk *c, struct player *p)
{
	int dir, k, x, y;
	int light = p->state.cur_light, radius = ABS(light) - 1;
	int old_light = square_light(c, p->grid);

	/* Starting values based on permanent light */
	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			struct loc grid = loc(x, y);

			if (square_isglow(c, grid) &&
					(square_allowslos(c, grid) ||
					glow_can_light_wall(c, p, grid))) {
				c->squares[y][x].light = 1;
			} else {
				c->squares[y][x].light = 0;
			}

			/* Squares with bright terrain have intensity 2 */
			if (square_isbright(c, grid)) {
				c->squares[y][x].light += 2;
				for (dir = 0; dir < 8; dir++) {
					struct loc adj_grid = loc_sum(grid, ddgrid_ddd[dir]);
					if (!square_in_bounds(c, adj_grid)) continue;
					/*
					 * Only brighten a wall if the player
					 * is in position to view the face
					 * that's lit up.
					 */
					if (!square_allowslos(c, adj_grid) &&
							!source_can_light_wall(
							c, p, grid, adj_grid))
							continue;
					c->squares[adj_grid.y][adj_grid.x].light += 1;
				}
			}
		}
	}

	/* Light around the player */
	add_light(c, p, p->grid, radius, light);

	/* Scan monster list and add monster light or darkness */
	for (k = 1; k < cave_monster_max(c); k++) {
		/* Check the k'th monster */
		struct monster *mon = cave_monster(c, k);

		/* Skip dead monsters */
		if (!mon->race) continue;

		/* Skip if the monster is hidden */
		if (monster_is_camouflaged(mon)) continue;

		/* Get light info for this monster */
		light = mon->race->light;
		radius = ABS(light) - 1;

		/* Skip monsters not affecting light */
		if (!light) continue;

		/* Skip if the player can't see it. */
		if (distance(p->grid, mon->grid) - radius > z_info->max_sight)
			continue;

		add_light(c, p, mon->grid, radius, light);
	}

	/* Update light level indicator */
	if (square_light(c, p->grid) != old_light) {
		p->upkeep->redraw |= PR_LIGHT;
	}
}